

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O1

void __thiscall Reducer::applyTestToWorking(Reducer *this)

{
  size_type *psVar1;
  size_type *psVar2;
  long *plVar3;
  bool bVar4;
  size_t __val;
  char cVar5;
  undefined8 *puVar6;
  size_t sVar7;
  char cVar8;
  pointer pcVar9;
  long *local_e8 [2];
  long local_d8 [2];
  long *local_c8 [2];
  long local_b8 [2];
  long *local_a8 [2];
  long local_98 [2];
  long *local_88;
  undefined8 local_80;
  long local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  size_type *local_68;
  __string_type __str;
  string __str_1;
  
  pcVar9 = (this->test)._M_dataplus._M_p;
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_e8,pcVar9,pcVar9 + (this->test)._M_string_length);
  pcVar9 = (this->working)._M_dataplus._M_p;
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a8,pcVar9,pcVar9 + (this->working)._M_string_length);
  wasm::copy_file(local_e8,local_a8);
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  if (local_e8[0] != local_d8) {
    operator_delete(local_e8[0],local_d8[0] + 1);
  }
  if (saveAllWorkingFiles != '\x01') {
    return;
  }
  pcVar9 = (this->working)._M_dataplus._M_p;
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,pcVar9,pcVar9 + (this->working)._M_string_length);
  psVar1 = &__str._M_string_length;
  pcVar9 = (this->working)._M_dataplus._M_p;
  local_68 = psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar9,pcVar9 + (this->working)._M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)&local_68,(ulong)__str._M_dataplus._M_p,0,'\x01');
  __val = workingFileIndex;
  cVar8 = '\x01';
  if (9 < workingFileIndex) {
    sVar7 = workingFileIndex;
    cVar5 = '\x04';
    do {
      cVar8 = cVar5;
      if (sVar7 < 100) {
        cVar8 = cVar8 + -2;
        goto LAB_00127407;
      }
      if (sVar7 < 1000) {
        cVar8 = cVar8 + -1;
        goto LAB_00127407;
      }
      if (sVar7 < 10000) goto LAB_00127407;
      bVar4 = 99999 < sVar7;
      sVar7 = sVar7 / 10000;
      cVar5 = cVar8 + '\x04';
    } while (bVar4);
    cVar8 = cVar8 + '\x01';
  }
LAB_00127407:
  psVar2 = &__str_1._M_string_length;
  workingFileIndex = workingFileIndex + 1;
  __str.field_2._8_8_ = psVar2;
  std::__cxx11::string::_M_construct((ulong)((long)&__str.field_2 + 8),cVar8);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)__str.field_2._8_8_,(uint)__str_1._M_dataplus._M_p,__val);
  pcVar9 = (pointer)0xf;
  if (local_68 != psVar1) {
    pcVar9 = (pointer)__str._M_string_length;
  }
  if (pcVar9 < __str._M_dataplus._M_p +
               CONCAT44(__str_1._M_dataplus._M_p._4_4_,(uint)__str_1._M_dataplus._M_p)) {
    pcVar9 = (pointer)0xf;
    if ((size_type *)__str.field_2._8_8_ != psVar2) {
      pcVar9 = (pointer)__str_1._M_string_length;
    }
    if (__str._M_dataplus._M_p +
        CONCAT44(__str_1._M_dataplus._M_p._4_4_,(uint)__str_1._M_dataplus._M_p) <= pcVar9) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)((long)&__str.field_2 + 8),0,(char *)0x0,(ulong)local_68);
      goto LAB_0012747f;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_68,__str.field_2._8_8_);
LAB_0012747f:
  local_88 = &local_78;
  plVar3 = puVar6 + 2;
  if ((long *)*puVar6 == plVar3) {
    local_78 = *plVar3;
    uStack_70 = *(undefined4 *)(puVar6 + 3);
    uStack_6c = *(undefined4 *)((long)puVar6 + 0x1c);
  }
  else {
    local_78 = *plVar3;
    local_88 = (long *)*puVar6;
  }
  local_80 = puVar6[1];
  *puVar6 = plVar3;
  puVar6[1] = 0;
  *(undefined1 *)plVar3 = 0;
  wasm::copy_file(local_c8,&local_88);
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if ((size_type *)__str.field_2._8_8_ != psVar2) {
    operator_delete((void *)__str.field_2._8_8_,__str_1._M_string_length + 1);
  }
  if (local_68 != psVar1) {
    operator_delete(local_68,__str._M_string_length + 1);
  }
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
  return;
}

Assistant:

void applyTestToWorking() {
    copy_file(test, working);

    if (saveAllWorkingFiles) {
      copy_file(working, working + '.' + std::to_string(workingFileIndex++));
    }
  }